

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O0

int __thiscall dit::FrameworkTests::init(FrameworkTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  FrameworkTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  anon_unknown_0::CommonFrameworkTests::CommonFrameworkTests
            ((CommonFrameworkTests *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  anon_unknown_0::CaseListParserTests::CaseListParserTests
            ((CaseListParserTests *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  anon_unknown_0::ReferenceRendererTests::ReferenceRendererTests
            ((ReferenceRendererTests *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createTextureFormatTests((this->super_TestCaseGroup).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAstcTests((this->super_TestCaseGroup).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createVulkanTests((this->super_TestCaseGroup).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void FrameworkTests::init (void)
{
	addChild(new CommonFrameworkTests	(m_testCtx));
	addChild(new CaseListParserTests	(m_testCtx));
	addChild(new ReferenceRendererTests	(m_testCtx));
	addChild(createTextureFormatTests	(m_testCtx));
	addChild(createAstcTests			(m_testCtx));
	addChild(createVulkanTests			(m_testCtx));
}